

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmCommonTargetGenerator::GetFlags
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this,string *l)

{
  char *pcVar1;
  cmGeneratorTarget *pcVar2;
  cmLocalCommonGenerator *pcVar3;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *this_00;
  bool bVar4;
  iterator iVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar6;
  value_type entry;
  string flags;
  allocator local_a1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  string *local_60;
  string local_58;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_38;
  
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->FlagsByLanguage)._M_t,l);
  if ((_Rb_tree_header *)iVar5._M_node ==
      &(this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    pcVar1 = (l->_M_dataplus)._M_p;
    local_38 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&this->FlagsByLanguage;
    std::__cxx11::string::string((string *)&local_a0,pcVar1,&local_a1);
    AddFeatureFlags(this,&local_58,&local_a0.first);
    std::__cxx11::string::~string((string *)&local_a0);
    pcVar2 = this->GeneratorTarget;
    pcVar3 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_a0,pcVar1,&local_a1);
    local_60 = &this->ConfigName;
    cmLocalGenerator::AddArchitectureFlags
              (&pcVar3->super_cmLocalGenerator,&local_58,pcVar2,&local_a0.first,local_60);
    std::__cxx11::string::~string((string *)&local_a0);
    bVar4 = std::operator==(l,"Fortran");
    if (bVar4) {
      AddFortranFlags(this,&local_58);
    }
    pcVar2 = this->GeneratorTarget;
    pcVar3 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_a0,pcVar1,&local_a1);
    cmLocalGenerator::AddCMP0018Flags
              (&pcVar3->super_cmLocalGenerator,&local_58,pcVar2,&local_a0.first,local_60);
    std::__cxx11::string::~string((string *)&local_a0);
    pcVar2 = this->GeneratorTarget;
    pcVar3 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_a0,pcVar1,&local_a1);
    cmLocalGenerator::AddVisibilityPresetFlags
              (&pcVar3->super_cmLocalGenerator,&local_58,pcVar2,&local_a0.first);
    std::__cxx11::string::~string((string *)&local_a0);
    (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
              (this->LocalGenerator,&local_58,(this->Makefile->DefineFlags)._M_dataplus._M_p);
    pcVar3 = this->LocalGenerator;
    GetFrameworkFlags(&local_a0.first,this,l);
    (*(pcVar3->super_cmLocalGenerator)._vptr_cmLocalGenerator[5])(pcVar3,&local_58,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    pcVar2 = this->GeneratorTarget;
    pcVar3 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_a0,pcVar1,&local_a1);
    cmLocalGenerator::AddCompileOptions
              (&pcVar3->super_cmLocalGenerator,&local_58,pcVar2,&local_a0.first,local_60);
    this_00 = local_38;
    std::__cxx11::string::~string((string *)&local_a0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_a0,l,&local_58);
    pVar6 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>&>
                      (this_00,&local_a0);
    iVar5._M_node = (_Base_ptr)pVar6.first._M_node;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_a0);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(iVar5._M_node + 2));
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::GetFlags(const std::string &l)
{
  ByLanguageMap::iterator i = this->FlagsByLanguage.find(l);
  if (i == this->FlagsByLanguage.end())
    {
    std::string flags;
    const char *lang = l.c_str();

    // Add language feature flags.
    this->AddFeatureFlags(flags, lang);

    this->LocalGenerator->AddArchitectureFlags(flags, this->GeneratorTarget,
                                               lang, this->ConfigName);

    // Fortran-specific flags computed for this target.
    if(l == "Fortran")
      {
      this->AddFortranFlags(flags);
      }

    this->LocalGenerator->AddCMP0018Flags(flags, this->GeneratorTarget,
                                          lang, this->ConfigName);

    this->LocalGenerator->AddVisibilityPresetFlags(flags,
                                                   this->GeneratorTarget,
                                                   lang);

    // Append old-style preprocessor definition flags.
    this->LocalGenerator->
      AppendFlags(flags, this->Makefile->GetDefineFlags());

    // Add framework directory flags.
    this->LocalGenerator->
      AppendFlags(flags,this->GetFrameworkFlags(l));

    // Add target-specific flags.
    this->LocalGenerator->AddCompileOptions(flags, this->GeneratorTarget,
                                            lang, this->ConfigName);

    ByLanguageMap::value_type entry(l, flags);
    i = this->FlagsByLanguage.insert(entry).first;
    }
  return i->second;
}